

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O0

bool __thiscall
Diligent::VerifyResourceViewBinding<Diligent::TextureViewVkImpl,Diligent::TEXTURE_VIEW_TYPE>
          (Diligent *this,PipelineResourceDesc *ResDesc,BindResourceInfo *BindInfo,
          TextureViewVkImpl *pViewImpl,
          initializer_list<Diligent::TEXTURE_VIEW_TYPE> ExpectedViewTypes,
          RESOURCE_DIMENSION ExpectedResourceDimension,bool IsMultisample,IDeviceObject *pCachedView
          ,char *SignatureName)

{
  bool bVar1;
  TextureViewDesc *pTVar2;
  ostream *poVar3;
  const_iterator pTVar4;
  Char *pCVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args;
  undefined7 in_stack_00000011;
  undefined1 local_2a8 [8];
  string msg_1;
  undefined1 local_268 [8];
  string msg;
  TEXTURE_VIEW_TYPE ExpectedViewType_1;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  initializer_list<Diligent::TEXTURE_VIEW_TYPE> *__range4;
  undefined1 local_220 [7];
  bool IsFirstViewType;
  stringstream local_1f0 [8];
  stringstream ss;
  ostream local_1e0 [383];
  TEXTURE_VIEW_TYPE local_61;
  const_iterator pTStack_60;
  TEXTURE_VIEW_TYPE ExpectedViewType;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<Diligent::TEXTURE_VIEW_TYPE> *__range3;
  bool IsExpectedViewType;
  TEXTURE_VIEW_TYPE ViewType;
  char *pcStack_40;
  bool BindingOK;
  char *ExpectedResourceType;
  bool IsMultisample_local;
  TextureViewVkImpl *pTStack_30;
  RESOURCE_DIMENSION ExpectedResourceDimension_local;
  TextureViewVkImpl *pViewImpl_local;
  BindResourceInfo *BindInfo_local;
  PipelineResourceDesc *ResDesc_local;
  initializer_list<Diligent::TEXTURE_VIEW_TYPE> ExpectedViewTypes_local;
  
  ExpectedViewTypes_local._M_array = ExpectedViewTypes._M_array;
  ExpectedResourceType._7_1_ = (RESOURCE_DIMENSION)ExpectedViewTypes._M_len;
  ExpectedResourceType._6_1_ = ExpectedResourceDimension & RESOURCE_DIM_BUFFER;
  pTStack_30 = (TextureViewVkImpl *)BindInfo;
  pViewImpl_local = (TextureViewVkImpl *)ResDesc;
  BindInfo_local = (BindResourceInfo *)this;
  ResDesc_local = (PipelineResourceDesc *)pViewImpl;
  pcStack_40 = GetResourceTypeName<Diligent::TEXTURE_VIEW_TYPE>();
  __range3._7_1_ =
       VerifyResourceBinding<Diligent::TextureViewVkImpl>
                 (pcStack_40,(PipelineResourceDesc *)BindInfo_local,
                  (BindResourceInfo *)pViewImpl_local,pTStack_30,
                  (IDeviceObject *)CONCAT71(in_stack_00000011,IsMultisample),(char *)pCachedView);
  if (pTStack_30 != (TextureViewVkImpl *)0x0) {
    pTVar2 = DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
             ::GetDesc((DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                        *)pTStack_30);
    __range3._6_1_ = pTVar2->ViewType;
    __range3._5_1_ = 0;
    __begin0 = (const_iterator)&ResDesc_local;
    __end0 = std::initializer_list<Diligent::TEXTURE_VIEW_TYPE>::begin
                       ((initializer_list<Diligent::TEXTURE_VIEW_TYPE> *)__begin0);
    pTStack_60 = std::initializer_list<Diligent::TEXTURE_VIEW_TYPE>::end
                           ((initializer_list<Diligent::TEXTURE_VIEW_TYPE> *)__begin0);
    for (; __end0 != pTStack_60; __end0 = __end0 + 1) {
      local_61 = *__end0;
      if (local_61 == __range3._6_1_) {
        __range3._5_1_ = 1;
      }
    }
    if ((__range3._5_1_ & 1) == 0) {
      std::__cxx11::stringstream::stringstream(local_1f0);
      poVar3 = std::operator<<(local_1e0,"Error binding ");
      poVar3 = std::operator<<(poVar3,pcStack_40);
      poVar3 = std::operator<<(poVar3," \'");
      pTVar2 = DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
               ::GetDesc((DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                          *)pTStack_30);
      poVar3 = std::operator<<(poVar3,(pTVar2->super_DeviceObjectAttribs).Name);
      poVar3 = std::operator<<(poVar3,"\' to variable \'");
      GetShaderResourcePrintName<Diligent::PipelineResourceDesc>
                ((String *)local_220,(PipelineResourceDesc *)BindInfo_local,
                 *(Uint32 *)
                  ((long)&(pViewImpl_local->super_TextureViewBase<Diligent::EngineVkImplTraits>).
                          super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                          .super_ObjectBase<Diligent::ITextureViewVk>.
                          super_RefCountedObject<Diligent::ITextureViewVk>.m_pRefCounters + 4));
      poVar3 = std::operator<<(poVar3,(string *)local_220);
      std::operator<<(poVar3,'\'');
      std::__cxx11::string::~string((string *)local_220);
      if (pCachedView != (IDeviceObject *)0x0) {
        poVar3 = std::operator<<(local_1e0," defined by signature \'");
        poVar3 = std::operator<<(poVar3,(char *)pCachedView);
        std::operator<<(poVar3,'\'');
      }
      std::operator<<(local_1e0,". Incorrect view type: ");
      bVar1 = true;
      __end0_1 = std::initializer_list<Diligent::TEXTURE_VIEW_TYPE>::begin
                           ((initializer_list<Diligent::TEXTURE_VIEW_TYPE> *)&ResDesc_local);
      pTVar4 = std::initializer_list<Diligent::TEXTURE_VIEW_TYPE>::end
                         ((initializer_list<Diligent::TEXTURE_VIEW_TYPE> *)&ResDesc_local);
      for (; __end0_1 != pTVar4; __end0_1 = __end0_1 + 1) {
        msg.field_2._M_local_buf[0xf] = *__end0_1;
        if (!bVar1) {
          std::operator<<(local_1e0," or ");
        }
        pCVar5 = GetViewTypeLiteralName(msg.field_2._M_local_buf[0xf]);
        std::operator<<(local_1e0,pCVar5);
        bVar1 = false;
      }
      poVar3 = std::operator<<(local_1e0," is expected, ");
      pCVar5 = GetViewTypeLiteralName(__range3._6_1_);
      poVar3 = std::operator<<(poVar3,pCVar5);
      std::operator<<(poVar3," is provided.");
      std::__cxx11::stringstream::str();
      FormatString<std::__cxx11::string>
                ((string *)local_268,(Diligent *)(msg_1.field_2._M_local_buf + 8),Args);
      std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"VerifyResourceViewBinding",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                 ,0x1bf);
      std::__cxx11::string::~string((string *)local_268);
      __range3._7_1_ = 0;
      std::__cxx11::stringstream::~stringstream(local_1f0);
    }
    bVar1 = ValidateResourceViewDimension<Diligent::TextureViewVkImpl>
                      ((char *)BindInfo_local->pObject,BindInfo_local->ArrayIndex,
                       *(Uint32 *)
                        ((long)&(pViewImpl_local->
                                super_TextureViewBase<Diligent::EngineVkImplTraits>).
                                super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                                .super_ObjectBase<Diligent::ITextureViewVk>.
                                super_RefCountedObject<Diligent::ITextureViewVk>.m_pRefCounters + 4)
                       ,pTStack_30,ExpectedResourceType._7_1_,
                       (bool)(ExpectedResourceType._6_1_ & RESOURCE_DIM_BUFFER));
    if (!bVar1) {
      __range3._7_1_ = 0;
    }
  }
  if (((pViewImpl_local->super_TextureViewBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
       .m_pDevice != (RenderDeviceVkImpl *)0x0) ||
     ((pViewImpl_local->super_TextureViewBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
      .m_Desc.super_DeviceObjectAttribs.Name != (Char *)0x0)) {
    FormatString<char[132]>
              ((string *)local_2a8,
               (char (*) [132])
               "Buffer range may only be directly specified for constant buffers. To specify a range for a structured buffer, create a buffer view."
              );
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"VerifyResourceViewBinding",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0x1cd);
    std::__cxx11::string::~string((string *)local_2a8);
  }
  return (bool)(__range3._7_1_ & 1);
}

Assistant:

bool VerifyResourceViewBinding(const PipelineResourceDesc&             ResDesc,
                               const BindResourceInfo&                 BindInfo,
                               const ResourceViewImplType*             pViewImpl,
                               std::initializer_list<ViewTypeEnumType> ExpectedViewTypes,
                               RESOURCE_DIMENSION                      ExpectedResourceDimension,
                               bool                                    IsMultisample,
                               const IDeviceObject*                    pCachedView,
                               const char*                             SignatureName)
{
    const char* ExpectedResourceType = GetResourceTypeName<ViewTypeEnumType>();

    bool BindingOK = VerifyResourceBinding(ExpectedResourceType, ResDesc, BindInfo, pViewImpl, pCachedView, SignatureName);

    if (pViewImpl)
    {
        ViewTypeEnumType ViewType           = pViewImpl->GetDesc().ViewType;
        bool             IsExpectedViewType = false;
        for (ViewTypeEnumType ExpectedViewType : ExpectedViewTypes)
        {
            if (ExpectedViewType == ViewType)
                IsExpectedViewType = true;
        }

        if (!IsExpectedViewType)
        {
            std::stringstream ss;
            ss << "Error binding " << ExpectedResourceType << " '" << pViewImpl->GetDesc().Name << "' to variable '"
               << GetShaderResourcePrintName(ResDesc, BindInfo.ArrayIndex) << '\'';
            if (SignatureName != nullptr)
            {
                ss << " defined by signature '" << SignatureName << '\'';
            }
            ss << ". Incorrect view type: ";
            bool IsFirstViewType = true;
            for (ViewTypeEnumType ExpectedViewType : ExpectedViewTypes)
            {
                if (!IsFirstViewType)
                {
                    ss << " or ";
                }
                ss << GetViewTypeLiteralName(ExpectedViewType);
                IsFirstViewType = false;
            }
            ss << " is expected, " << GetViewTypeLiteralName(ViewType) << " is provided.";
            RESOURCE_VALIDATION_FAILURE(ss.str());

            BindingOK = false;
        }

        if (!ValidateResourceViewDimension(ResDesc.Name, ResDesc.ArraySize, BindInfo.ArrayIndex, pViewImpl, ExpectedResourceDimension, IsMultisample))
        {
            BindingOK = false;
        }
    }

    if (BindInfo.BufferBaseOffset != 0 || BindInfo.BufferRangeSize != 0)
    {
        RESOURCE_VALIDATION_FAILURE("Buffer range may only be directly specified for constant buffers. "
                                    "To specify a range for a structured buffer, create a buffer view.");
    }

    return BindingOK;
}